

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_default<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (void *param_1,keywords<0UL> *param_2,undefined8 param_3,undefined8 param_4,
          undefined8 param_5)

{
  default_implementation_t pfVar1;
  first_type *in_stack_ffffffffffffff70;
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *this;
  keywords<0UL> *keywords_or_signature;
  default_call_policies *policies;
  first_type in_stack_ffffffffffffff90;
  default_call_policies local_48 [8];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  keywords<0UL> *local_28;
  void *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_40 = param_5;
  local_38 = param_3;
  local_30 = param_4;
  local_28 = param_2;
  local_20 = param_1;
  local_10 = param_3;
  local_8 = param_4;
  detail::
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::default_implementation
            ((def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x3e8234);
  detail::error::
  virtual_function_default<PythonModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int)>
  ::must_be_derived_class_member<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int)>
            (in_stack_ffffffffffffff70);
  keywords_or_signature = local_28;
  pfVar1 = detail::
           def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           ::default_implementation
                     ((def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                       *)0x3e8250);
  this = (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *)*pfVar1;
  detail::
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::policies(this);
  detail::
  def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::keywords(this);
  policies = local_48;
  make_function<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>>
            (in_stack_ffffffffffffff90,policies,keywords_or_signature);
  objects::add_to_namespace((object *)param_1,(char *)keywords_or_signature,(object *)policies);
  api::object::~object((object *)0x3e82ca);
  return;
}

Assistant:

inline void def_default(
        char const* name
        , Fn
        , Helper const& helper
        , mpl::bool_<true>)
    {
        detail::error::virtual_function_default<W,Fn>::must_be_derived_class_member(
            helper.default_implementation());
            
        objects::add_to_namespace(
            *this, name,
            make_function(
                helper.default_implementation(), helper.policies(), helper.keywords())
            );
    }